

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRect(ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,
                   ImDrawCornerFlags rounding_corners,float thickness)

{
  ImVec2 *pIVar1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  float local_30;
  ImDrawCornerFlags local_2c;
  float thickness_local;
  ImDrawCornerFlags rounding_corners_local;
  float rounding_local;
  ImU32 col_local;
  ImVec2 *p_max_local;
  ImVec2 *p_min_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    local_30 = thickness;
    local_2c = rounding_corners;
    thickness_local = rounding;
    rounding_corners_local = col;
    _rounding_local = p_max;
    p_max_local = p_min;
    p_min_local = (ImVec2 *)this;
    if ((this->Flags & 1U) == 0) {
      ImVec2::ImVec2(&local_60,0.5,0.5);
      local_58 = operator+(p_min,&local_60);
      pIVar1 = _rounding_local;
      ImVec2::ImVec2(&local_70,0.49,0.49);
      local_68 = operator-(pIVar1,&local_70);
      PathRect(this,&local_58,&local_68,thickness_local,local_2c);
    }
    else {
      ImVec2::ImVec2(&local_40,0.5,0.5);
      local_38 = operator+(p_min,&local_40);
      pIVar1 = _rounding_local;
      ImVec2::ImVec2(&local_50,0.5,0.5);
      local_48 = operator-(pIVar1,&local_50);
      PathRect(this,&local_38,&local_48,thickness_local,local_2c);
    }
    PathStroke(this,rounding_corners_local,true,local_30);
  }
  return;
}

Assistant:

void ImDrawList::AddRect(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawCornerFlags rounding_corners, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
        PathRect(p_min + ImVec2(0.50f, 0.50f), p_max - ImVec2(0.50f, 0.50f), rounding, rounding_corners);
    else
        PathRect(p_min + ImVec2(0.50f, 0.50f), p_max - ImVec2(0.49f, 0.49f), rounding, rounding_corners); // Better looking lower-right corner and rounded non-AA shapes.
    PathStroke(col, true, thickness);
}